

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

int32 __thiscall
Js::JavascriptArray::HeadSegmentIndexOfHelper
          (JavascriptArray *this,Var search,uint32 *fromIndex,uint32 toIndex,bool includesAlgorithm,
          ScriptContext *scriptContext)

{
  Type TVar1;
  SparseArraySegmentBase *this_00;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  DynamicObjectFlags DVar5;
  uint uVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  undefined1 *aLeft;
  uint index;
  uint32 uVar9;
  uint32 local_34;
  
  TVar1 = ((this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->typeId;
  if (((3 < TVar1 - TypeIds_Array) || (TVar1 == TypeIds_ArrayLast)) ||
     (TVar1 == TypeIds_NativeIntArray)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x10a7,
                                "(IsNonES5Array(GetTypeId()) && !JavascriptNativeArray::Is(GetTypeId()))"
                                ,
                                "IsNonES5Array(GetTypeId()) && !JavascriptNativeArray::Is(GetTypeId())"
                               );
    if (!bVar3) goto LAB_00b83c7b;
    *puVar8 = 0;
  }
  DVar5 = DynamicObject::GetArrayFlags((DynamicObject *)this);
  uVar9 = 0xffffffff;
  if (((DVar5 & HasNoMissingValues) != None) && (*fromIndex < ((this->head).ptr)->length)) {
    if (((ulong)search & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)search & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) {
LAB_00b83c7b:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
    }
    this_00 = (this->head).ptr;
    uVar6 = this_00->length;
    if (toIndex <= uVar6) {
      uVar6 = toIndex;
    }
    index = *fromIndex;
    bVar3 = index < uVar6;
    if (bVar3) {
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        aLeft = (undefined1 *)
                SparseArraySegment<void_*>::GetElement((SparseArraySegment<void_*> *)this_00,index);
        if (((ulong)search & 0xffff000000000000) == 0x1000000000000) {
          if (((ulong)aLeft & 0x1ffff00000000) != 0x1000000000000 &&
              ((ulong)aLeft & 0xffff000000000000) == 0x1000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar4) goto LAB_00b83c7b;
            *puVar8 = 0;
          }
          if (((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) goto LAB_00b83bb7;
          if (aLeft != (undefined1 *)search) goto LAB_00b83c2c;
LAB_00b83be6:
          bVar4 = false;
          local_34 = index;
        }
        else {
LAB_00b83bb7:
          if (aLeft == &DAT_40002fff80002) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x10c0,"(false)","false");
            if (!bVar4) goto LAB_00b83c7b;
            *puVar8 = 0;
          }
          else if (((includesAlgorithm) &&
                   (bVar4 = JavascriptConversion::SameValueCommon<true>(aLeft,search), bVar4)) ||
                  (BVar7 = JavascriptOperators::StrictEqual(aLeft,search,scriptContext), BVar7 != 0)
                  ) goto LAB_00b83be6;
LAB_00b83c2c:
          bVar4 = true;
        }
        if (!bVar4) break;
        index = index + 1;
        bVar3 = index < uVar6;
      } while (index != uVar6);
    }
    uVar9 = local_34;
    if (!bVar3) {
      uVar6 = ((this->head).ptr)->length;
      uVar9 = 0xffffffff;
      if (toIndex <= uVar6) {
        uVar6 = 0xffffffff;
      }
      *fromIndex = uVar6;
    }
  }
  return uVar9;
}

Assistant:

int32 JavascriptArray::HeadSegmentIndexOfHelper(Var search, uint32 &fromIndex, uint32 toIndex, bool includesAlgorithm, ScriptContext * scriptContext)
    {
        Assert(IsNonES5Array(GetTypeId()) && !JavascriptNativeArray::Is(GetTypeId()));

        if (!HasNoMissingValues() || fromIndex >= GetHead()->length)
        {
            return -1;
        }

        bool isSearchTaggedInt = TaggedInt::Is(search);
        // We need to cast head segment to SparseArraySegment<Var> to have access to GetElement (onSparseArraySegment<T>). Because there are separate overloads of this
        // virtual method on JavascriptNativeIntArray and JavascriptNativeFloatArray, we know this version of this method will only be called for true JavascriptArray, and not for
        // either of the derived native arrays, so the elements of each segment used here must be Vars. Hence, the cast is safe.
        SparseArraySegment<Var>* head = static_cast<SparseArraySegment<Var>*>(GetHead());
        uint32 toIndexTrimmed = toIndex <= head->length ? toIndex : head->length;
        for (uint32 i = fromIndex; i < toIndexTrimmed; i++)
        {
            Var element = head->GetElement(i);
            if (isSearchTaggedInt && TaggedInt::Is(element))
            {
                if (search == element)
                {
                    return i;
                }
            }
            else if (SparseArraySegment<Var>::IsMissingItem(&element))
            {
                AssertOrFailFast(false);
            }
            else if (includesAlgorithm && JavascriptConversion::SameValueZero(element, search))
            {
                //Array.prototype.includes
                return i;
            }
            else if (JavascriptOperators::StrictEqual(element, search, scriptContext))
            {
                //Array.prototype.indexOf
                return i;
            }
        }

        // Element not found in the head segment. Keep looking only if the range of indices extends past
        // the head segment.
        fromIndex = toIndex > GetHead()->length ? GetHead()->length : -1;
        return -1;
    }